

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O1

FSerializer * __thiscall FSerializer::Terrain(FSerializer *this,char *key,int *terrain,int *def)

{
  int iVar1;
  FName terr;
  FName local_28;
  FName local_24;
  
  if (((def == (int *)0x0) || (this->w == (FWriter *)0x0)) || (*terrain != *def)) {
    P_GetTerrainName(*terrain);
    ::Serialize(this,key,&local_28,(FName *)0x0);
    if (this->r != (FReader *)0x0) {
      iVar1 = P_FindTerrain(&local_24);
      *terrain = iVar1;
    }
  }
  return this;
}

Assistant:

FSerializer &FSerializer::Terrain(const char *key, int &terrain, int *def)
{
	if (isWriting() && def != nullptr && terrain == *def)
	{
		return *this;
	}
	FName terr = P_GetTerrainName(terrain);
	Serialize(*this, key, terr, nullptr);
	if (isReading())
	{
		terrain = P_FindTerrain(terr);
	}
	return *this;
}